

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<unsigned_char_(unsigned_short)> * __thiscall
testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
          (TypedExpectation<unsigned_char_(unsigned_short)> *this,
          Action<unsigned_char_(unsigned_short)> *action)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  FailureReporterInterface *pFVar4;
  function<unsigned_char_(unsigned_short)> *this_00;
  linked_ptr<const_testing::CardinalityInterface> local_48;
  CardinalityInterface local_38 [2];
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  local_48.value_ = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().","");
  if (5 < (int)CVar1) {
    uVar2 = (this->super_ExpectationBase).line_;
    pcVar3 = (this->super_ExpectationBase).file_;
    pFVar4 = GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])(pFVar4,0,pcVar3,(ulong)uVar2,&local_48);
  }
  if (local_48.value_ != local_38) {
    operator_delete(local_48.value_,(long)local_38[0]._vptr_CardinalityInterface + 1);
  }
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  this_00 = (function<unsigned_char_(unsigned_short)> *)operator_new(0x30);
  std::function<unsigned_char_(unsigned_short)>::function(this_00,&action->fun_);
  linked_ptr<testing::ActionInterface<unsigned_char_(unsigned_short)>_>::linked_ptr
            ((linked_ptr<testing::ActionInterface<unsigned_char_(unsigned_short)>_> *)(this_00 + 1),
             &action->impl_);
  local_48.value_ = (CardinalityInterface *)this_00;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this->super_ExpectationBase).untyped_actions_,&local_48.value_);
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    Exactly((testing *)&local_48,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    linked_ptr<const_testing::CardinalityInterface>::operator=
              (&(this->super_ExpectationBase).cardinality_.impl_,&local_48);
    linked_ptr<const_testing::CardinalityInterface>::~linked_ptr(&local_48);
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }